

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O0

bool __thiscall
rapidjson::
GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
::EndArray(GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
           *this,SizeType elementCount)

{
  bool bVar1;
  SchemaValidationContext<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
  *pSVar2;
  SchemaType *this_00;
  Context *context_00;
  bool local_6a;
  bool local_69;
  GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
  *local_60;
  GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
  *local_50;
  uint local_30;
  uint local_2c;
  SizeType i__1;
  SizeType i_;
  Context *context;
  SizeType elementCount_local;
  GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
  *this_local;
  
  if ((this->valid_ & 1U) == 0) {
    return false;
  }
  for (_i__1 = internal::Stack<rapidjson::CrtAllocator>::
               Bottom<rapidjson::internal::SchemaValidationContext<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::CrtAllocator>>>
                         (&this->schemaStack_);
      pSVar2 = internal::Stack<rapidjson::CrtAllocator>::
               End<rapidjson::internal::SchemaValidationContext<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::CrtAllocator>>>
                         (&this->schemaStack_), _i__1 != pSVar2; _i__1 = _i__1 + 1) {
    if (_i__1->hasher != (void *)0x0) {
      internal::Hasher<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::EndArray
                ((Hasher<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)_i__1->hasher,
                 elementCount);
    }
    if (_i__1->validators != (ISchemaValidator **)0x0) {
      for (local_2c = 0; local_2c < _i__1->validatorCount; local_2c = local_2c + 1) {
        if (_i__1->validators[local_2c] == (ISchemaValidator *)0x0) {
          local_50 = (GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
                      *)0x0;
        }
        else {
          local_50 = (GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
                      *)(_i__1->validators[local_2c] + -1);
        }
        EndArray(local_50,elementCount);
      }
    }
    if (_i__1->patternPropertiesValidators != (ISchemaValidator **)0x0) {
      for (local_30 = 0; local_30 < _i__1->patternPropertiesValidatorCount; local_30 = local_30 + 1)
      {
        if (_i__1->patternPropertiesValidators[local_30] == (ISchemaValidator *)0x0) {
          local_60 = (GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
                      *)0x0;
        }
        else {
          local_60 = (GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
                      *)(_i__1->patternPropertiesValidators[local_30] + -1);
        }
        EndArray(local_60,elementCount);
      }
    }
  }
  this_00 = CurrentSchema(this);
  context_00 = CurrentContext(this);
  bVar1 = internal::
          Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
          ::EndArray(this_00,context_00,elementCount);
  if ((!bVar1) && (bVar1 = GetContinueOnErrors(this), !bVar1)) {
    this->valid_ = false;
    return (bool)(this->valid_ & 1);
  }
  bVar1 = EndValue(this);
  if (!bVar1) {
    bVar1 = GetContinueOnErrors(this);
    local_69 = false;
    if (!bVar1) goto LAB_00180e8c;
  }
  local_6a = true;
  if (this->outputHandler_ != (BaseReaderHandler<rapidjson::UTF8<char>,_void> *)0x0) {
    local_6a = BaseReaderHandler<rapidjson::UTF8<char>,_void>::EndArray
                         (this->outputHandler_,elementCount);
  }
  local_69 = local_6a;
LAB_00180e8c:
  this->valid_ = local_69;
  return (bool)(this->valid_ & 1);
}

Assistant:

bool EndArray(SizeType elementCount) {
        RAPIDJSON_SCHEMA_PRINT(Method, "GenericSchemaValidator::EndArray");
        if (!valid_) return false;
        RAPIDJSON_SCHEMA_HANDLE_PARALLEL_(EndArray, (elementCount));
        if (!CurrentSchema().EndArray(CurrentContext(), elementCount) && !GetContinueOnErrors()) {
            valid_ = false;
            return valid_;
        }
        RAPIDJSON_SCHEMA_HANDLE_END_(EndArray, (elementCount));
    }